

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O0

void lsvm::hashmap::free(void *__ptr)

{
  uint uVar1;
  hashbucket **bp;
  uint32_t i;
  uint32_t max_partitions;
  uint uVar2;
  
  uVar1 = *(ushort *)((long)__ptr + 0x16) + 1;
  uVar2 = 0;
  buckets((hashmap *)__ptr);
  for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    free_bucket((hashbucket *)CONCAT44(uVar1,uVar2));
  }
  memory::retain((void *)CONCAT44(uVar1,uVar2));
  return;
}

Assistant:

void free(hashmap* h){
    // calculate current max partitions
    uint32_t max_partitions = partition_count(h->bits);

    // free all buckets
    uint32_t i = 0;
    hashbucket** bp = buckets(h);
    while(i < max_partitions){
        free_bucket(bp[i]);    
        ++i;
    }

    // free hashmap
    lsvm::memory::retain(h);
}